

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,CheckerInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  HierarchicalInstanceSyntax *instance;
  size_type sVar1;
  pointer ppSVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  NetType *netType;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  UninstantiatedDefSymbol *this;
  ulong uVar4;
  long lVar5;
  string_view sVar6;
  ASTContext context;
  UninstantiatedDefSymbol *local_180;
  string_view local_178;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_158;
  Token local_140;
  ASTContext local_130;
  undefined1 local_f8 [144];
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ASTContext::resetFlags(&local_130,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  local_140 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(syntax->type).ptr);
  sVar6 = parsing::Token::valueText(&local_140);
  local_f8._128_8_ = local_f8;
  local_68.groups_size_index = 0x3f;
  local_68.groups_size_mask = 1;
  local_68.elements_ = (value_type_pointer)0x0;
  local_68.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_48 = 0;
  uStack_40 = 0;
  local_f8._136_8_ = local_f8._128_8_;
  netType = Scope::getDefaultNetType(local_130.scope.ptr);
  uVar4 = (syntax->instances).elements._M_extent._M_extent_value + 1;
  if (1 < uVar4) {
    uVar4 = uVar4 >> 1;
    lVar5 = 0;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->instances).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar5));
      instance = (HierarchicalInstanceSyntax *)*ppSVar3;
      local_168._M_ptr = (pointer)0x0;
      local_168._M_extent._M_extent_value = 0;
      local_178 = sVar6;
      anon_unknown.dwarf_1efa1d1::createImplicitNets
                (instance,&local_130,netType,(bitmask<slang::ast::InstanceFlags>)0x0,
                 (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                  *)local_f8,implicitNets);
      anon_unknown.dwarf_1efa1d1::getNameLoc(&local_158,instance);
      this = BumpAllocator::
             emplace<slang::ast::UninstantiatedDefSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                       (&compilation->super_BumpAllocator,&local_158.first,&local_158.second,
                        &local_178,&local_168);
      (this->super_Symbol).originatingSyntax = (SyntaxNode *)instance;
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&this->super_Symbol,local_130.scope.ptr,syntax_00);
      local_180 = this;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)&local_180);
      lVar5 = lVar5 + 0x30;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_f8._136_8_,&local_68);
  sVar1 = results->len;
  if (sVar1 != 0) {
    ppSVar2 = results->data_;
    lVar5 = 0;
    do {
      *(undefined1 *)(*(long *)((long)ppSVar2 + lVar5) + 0x88) = 1;
      lVar5 = lVar5 + 8;
    } while (sVar1 << 3 != lVar5);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const CheckerInstantiationSyntax& syntax,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    createUninstantiatedDefs(compilation, syntax, syntax.type->getLastToken().valueText(), context,
                             {}, results, implicitNets);

    for (auto sym : results)
        sym->as<UninstantiatedDefSymbol>().mustBeChecker = true;
}